

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.h
# Opt level: O0

void __thiscall EventLoop::assertInLoopThread(EventLoop *this)

{
  bool bVar1;
  EventLoop *this_local;
  
  bVar1 = isInLoopThread(this);
  if (!bVar1) {
    __assert_fail("isInLoopThread()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.h"
                  ,0x1a,"void EventLoop::assertInLoopThread()");
  }
  return;
}

Assistant:

void assertInLoopThread() { assert(isInLoopThread()); }